

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unexepack.cc
# Opt level: O2

void __thiscall explode::unexepack::unexepack(unexepack *this,input_exe_file *inp)

{
  ushort uVar1;
  input *piVar2;
  uint16_t *puVar3;
  decoder_error *this_00;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> ibuff;
  char ch;
  
  piVar2 = input_exe_file::file(inp);
  this->m_file = piVar2;
  this->m_exe_file = inp;
  puVar3 = exe_file::operator[](&inp->super_exe_file,INITIAL_IP);
  if ((0x14 < *puVar3) || ((0x150000U >> (*puVar3 & 0x1f) & 1) == 0)) {
    this_00 = (decoder_error *)__cxa_allocate_exception(0x10);
    decoder_error::decoder_error(this_00,"unsupported version");
LAB_00109dc0:
    __cxa_throw(this_00,&decoder_error::typeinfo,decoder_error::~decoder_error);
  }
  puVar3 = exe_file::operator[](&inp->super_exe_file,HEADER_SIZE_PARA);
  this->m_exe_data_start = (uint)*puVar3 << 4;
  puVar3 = exe_file::operator[](&inp->super_exe_file,INITIAL_CS);
  uVar7 = (uint)*puVar3 * 0x10 + this->m_exe_data_start;
  (*this->m_file->_vptr_input[5])(this->m_file,(ulong)uVar7);
  (*this->m_file->_vptr_input[2])(this->m_file,this->m_header,0x12);
  puVar3 = exe_file::operator[](&inp->super_exe_file,INITIAL_IP);
  if (*(short *)((long)this->m_header + (ulong)(*puVar3 - 2 & 0xfffe)) == 0x4252) {
    puVar3 = exe_file::operator[](&inp->super_exe_file,INITIAL_IP);
    iVar6 = 0;
    if (*puVar3 == 0x10) {
      puVar3 = exe_file::operator[](&inp->super_exe_file,INITIAL_IP);
      iVar6 = 0x125;
      if (this->m_header[*puVar3 & 0xfffffffe] == 0xe88b) {
        iVar6 = 0x132;
      }
    }
    puVar3 = exe_file::operator[](&inp->super_exe_file,INITIAL_IP);
    iVar5 = 0x12d;
    if (*puVar3 != 0x12) {
      iVar5 = iVar6;
    }
    puVar3 = exe_file::operator[](&inp->super_exe_file,INITIAL_IP);
    iVar6 = 0x131;
    if (*puVar3 != 0x14) {
      iVar6 = iVar5;
    }
    uVar4 = (uVar7 >> 0x10) + 1;
    if ((iVar6 + uVar7 & 0xfff8) == 0) {
      uVar4 = uVar7 >> 0x10;
    }
    (*this->m_file->_vptr_input[5])
              (this->m_file,(ulong)((uVar4 * 0x10000 + (iVar6 + uVar7 + 0xfff9 & 0xffff)) - 0x10000)
              );
    (*this->m_file->_vptr_input[2])
              (this->m_file,
               (undefined1 *)
               ((long)&ibuff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 6),1);
    if (ibuff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ != 'c') {
      this_00 = (decoder_error *)__cxa_allocate_exception(0x10);
      decoder_error::decoder_error(this_00,"not an exepack");
      goto LAB_00109dc0;
    }
    puVar3 = exe_file::operator[](&inp->super_exe_file,INITIAL_CS);
    uVar1 = *puVar3;
    puVar3 = exe_file::operator[](&inp->super_exe_file,HEADER_SIZE_PARA);
    (*this->m_file->_vptr_input[5])(this->m_file,(ulong)*puVar3 << 4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,(ulong)uVar1 << 4,
               (allocator_type *)
               ((long)&ibuff.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    (*this->m_file->_vptr_input[2])(this->m_file,local_50,(ulong)uVar1 << 4);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  }
  return;
}

Assistant:

unexepack::unexepack(input_exe_file& inp)
		: m_file(inp.file()),
		m_exe_file(inp)
	{
		const uint16_t ip = inp[exe_file::INITIAL_IP];
		if (ip != 0x10 && ip != 0x12 && ip != 0x14)
		{
			throw decoder_error ("unsupported version");
		}
		m_exe_data_start = inp[exe_file::HEADER_SIZE_PARA] * 16L;
		uint32_t var_2c = inp[exe_file::INITIAL_CS] * 16L;
		var_2c += m_exe_data_start;
		m_file.seek(var_2c);
		union
		{
			char* bytes;
			uint16_t* words;
		} u;
		u.words = m_header;
		m_file.read_buff (u.bytes, sizeof(m_header));
		for (int i = 0; i < eMAX_HEADER_VAL; i++)
		{
			m_header[i] = byte_order::from_little_endian(m_header[i]);
		}

		uint16_t sig_ptr = inp[exe_file::INITIAL_IP];
		sig_ptr += 0x0FFFE;
		sig_ptr = sig_ptr >> 1;

		uint16_t signature = u.words[sig_ptr];

		if (signature == 0x4252)
		{
			uint32_t len = 0;
			uint32_t var_36 = 0;
			// 10729
			if (inp[exe_file::INITIAL_IP] == 0x10)
			{
				// 10733
				uint16_t p = inp[exe_file::INITIAL_IP] >> 1;
				p = p << 1;
				uint16_t w = u.words[p];
				if (w == 0xe88b)
				{
					// 10750
					// second generation
					len = 0x132;
				}
				else
				{
					len = 0x125;
				}
			}
			if (inp[exe_file::INITIAL_IP] == 0x12)
			{
				len = 0x12d;
			}
			
			if (inp[exe_file::INITIAL_IP] == 0x14)
			{
				var_36 = 1;
				len = 0x131;
			}
			uint16_t lo = var_2c & 0xFFFF;
			uint16_t hi = (var_2c & 0xFFFF0000)>> 16;
			lo += (uint16_t)len;
			if (lo > 7)
			{
				hi++;
			}
			lo = lo + (uint16_t)0xFFF9;
			hi = hi + (uint16_t)0xFFFF;

			uint32_t p = ((uint32_t)hi << 16) | lo;
			m_file.seek(p);
			char ch;
			m_file.read_buff(&ch, 1);

			if (ch != 0x63)
			{
				throw decoder_error("not an exepack");
			}

			uint16_t ax = var_36;
			ax += 6;
			
			uint32_t uncompressed_size = ((uint32_t)u.words[ax] & 0xFFFF) << 4;
			uint32_t var_8 = ((uint32_t)inp[exe_file::INITIAL_CS] & 0xFFFF) << 4;
			uint32_t offs = ((uint32_t)inp[exe_file::HEADER_SIZE_PARA] & 0xFFFF) << 4;
			
			m_file.seek(offs);
			std::vector <uint8_t> ibuff(var_8);
			m_file.read_buff((char*)&ibuff[0], var_8);
			
			uint16_t bytes_in = var_8;

			


		}
		// goto 107f5
		
		return;
	}